

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O3

bool testAssignFromInitList(void)

{
  bool bVar1;
  ostream *poVar2;
  bool bVar3;
  int iVar4;
  initializer_list<char> il;
  String str;
  char local_2b [3];
  String local_28;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"testAssignFromInitList()\n",0x19);
  local_28.view_._M_len = 0;
  local_28.view_._M_str = (char *)0x0;
  local_28.string_.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_28.string_.
  super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2b[0] = 'a';
  local_2b[1] = 'b';
  local_2b[2] = 99;
  il._M_len = 3;
  il._M_array = local_2b;
  cm::String::operator=(&local_28,il);
  if (local_28.view_._M_len == 3) {
    if (((*local_28.view_._M_str == 'a') && (local_28.view_._M_str[1] == 'b')) &&
       (local_28.view_._M_str[2] == 'c')) {
      bVar1 = cm::String::is_stable(&local_28);
      bVar3 = true;
      if (bVar1) goto LAB_001c2c2b;
      iVar4 = 0xf2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.is_stable()) failed on line ",0x2c);
    }
    else {
      iVar4 = 0xf1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(std::strncmp(str.data(), \"abc\", 3) == 0) failed on line ",0x44);
    }
  }
  else {
    iVar4 = 0xf0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str.size() == 3) failed on line ",0x2c);
  }
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  bVar3 = false;
LAB_001c2c2b:
  if (local_28.string_.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.string_.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar3;
}

Assistant:

static bool testMethod_front_back()
{
  std::cout << "testMethod_front_back()\n";
  cm::String str = "abc";
  ASSERT_TRUE(str.front() == 'a');
  ASSERT_TRUE(str.back() == 'c');
  return true;
}